

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::EnumVal::Deserialize(EnumVal *this,Parser *parser,EnumVal *val)

{
  bool bVar1;
  ushort uVar2;
  ulong uVar3;
  long lVar4;
  unsigned_short vtsize;
  ushort uVar5;
  int64_t iVar6;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  long *local_48 [2];
  long local_38 [2];
  
  if (*(ushort *)(val + -(long)*(int *)val) < 5) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(val + (4 - (long)*(int *)val));
  }
  uVar3 = (ulong)uVar2;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,val + *(uint *)(val + uVar3) + uVar3 + 4,
             val + (ulong)*(uint *)(val + *(uint *)(val + uVar3) + uVar3) +
                   *(uint *)(val + uVar3) + uVar3 + 4);
  std::__cxx11::string::operator=((string *)this,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  lVar4 = -(long)*(int *)val;
  uVar2 = *(ushort *)(val + -(long)*(int *)val);
  if (uVar2 < 7) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(val + lVar4 + 6);
  }
  if (uVar5 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int64_t *)(val + uVar5);
  }
  this->value = iVar6;
  if (uVar2 < 0xb) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(val + lVar4 + 10);
  }
  if (uVar2 == 0) {
    type = (Type *)0x0;
  }
  else {
    type = (Type *)(val + (ulong)*(uint *)(val + uVar2) + (ulong)uVar2);
  }
  bVar1 = Type::Deserialize(&this->union_type,parser,type);
  if (bVar1) {
    if (*(ushort *)(val + -(long)*(int *)val) < 0xf) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(val + (0xe - (long)*(int *)val));
    }
    if (uVar2 == 0) {
      attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
    }
    else {
      attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
              (val + (ulong)*(uint *)(val + uVar2) + (ulong)uVar2);
    }
    bVar1 = DeserializeAttributesCommon(&this->attributes,parser,attrs);
    if (bVar1) {
      if (*(ushort *)(val + -(long)*(int *)val) < 0xd) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(val + (0xc - (long)*(int *)val));
      }
      if (uVar2 == 0) {
        documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
      }
      else {
        documentation =
             (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
             (val + (ulong)*(uint *)(val + uVar2) + (ulong)uVar2);
      }
      anon_unknown_0::DeserializeDoc(&this->doc_comment,documentation);
      return true;
    }
  }
  return false;
}

Assistant:

bool EnumVal::Deserialize(Parser &parser, const reflection::EnumVal *val) {
  name = val->name()->str();
  value = val->value();
  if (!union_type.Deserialize(parser, val->union_type())) return false;
  if (!DeserializeAttributes(parser, val->attributes())) return false;
  DeserializeDoc(doc_comment, val->documentation());
  return true;
}